

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O0

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<unsigned_long,void>
          (ostream_base *this,unsigned_long v)

{
  ostream_base *poVar1;
  span<const_char,__1L> s;
  not_null<std::array<char,_20UL>_*> local_48;
  undefined1 local_40 [8];
  pair<const_char_*,_const_char_*> res;
  base10storage<unsigned_long> str;
  unsigned_long v_local;
  ostream_base *this_local;
  
  memset((void *)((long)&res.second + 4),0,0x14);
  gsl::not_null<std::array<char,_20UL>_*>::not_null
            (&local_48,(array<char,_20UL> *)((long)&res.second + 4));
  _local_40 = details::to_characters<unsigned_long,_void>(v,local_48);
  s = gsl::make_span<char_const>((char *)local_40,res.first);
  poVar1 = write<_1l>(this,s);
  return poVar1;
}

Assistant:

ostream_base & write (Unsigned const v) {
                    details::base10storage<Unsigned> str{{}};
                    auto res = details::to_characters (v, &str);
                    return this->write (gsl::make_span (res.first, res.second));
                }